

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdc.c
# Opt level: O0

void pcut_str_error(int error,char *buffer,int size)

{
  char *local_28;
  char *str;
  int size_local;
  char *buffer_local;
  int error_local;
  
  local_28 = strerror(error);
  if (local_28 == (char *)0x0) {
    local_28 = "(strerror failure)";
  }
  strncpy(buffer,local_28,(long)(size + -1));
  buffer[size + -1] = '\0';
  return;
}

Assistant:

void pcut_str_error(int error, char *buffer, int size) {
	const char *str = strerror(error);
	if (str == NULL) {
		str = "(strerror failure)";
	}
	strncpy(buffer, str, size - 1);
	/* Ensure correct termination. */
	buffer[size - 1] = 0;
}